

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_VectorFancyOpts_Test::TestBody(TApp_VectorFancyOpts_Test *this)

{
  input_t *piVar1;
  TApp *this_00;
  App *this_01;
  bool bVar2;
  Option *pOVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  answer;
  AssertHelper local_168;
  AssertHelper local_160;
  TApp *local_158;
  App *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"mystring","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"mystring2","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"mystring3","");
  __l._M_len = 3;
  __l._M_array = &local_148;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l,(allocator_type *)&local_168);
  lVar4 = 0;
  do {
    if (local_f8 + lVar4 != *(undefined1 **)((long)local_108 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_108 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x60);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-s,--string","");
  pcVar5 = "";
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  local_150 = &(this->super_TApp).app;
  local_158 = &this->super_TApp;
  pOVar3 = CLI::App::add_option<std::__cxx11::string>(local_150,&local_50,&local_c8,&local_70);
  (pOVar3->super_OptionBase<CLI::Option>).required_ = true;
  pOVar3 = CLI::Option::expected(pOVar3,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_168.data_._0_4_ = 3;
  local_160.data_._0_4_ = pOVar3->expected_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_148,"3","opt->get_expected()",(int *)&local_168,(int *)&local_160);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3ba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_168.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_168.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"--string","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"mystring","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"mystring2","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"mystring3","");
  this_01 = local_150;
  this_00 = local_158;
  piVar1 = &local_158->args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_148,
             &local_c8);
  lVar4 = 0;
  do {
    if (local_d8 + lVar4 != *(undefined1 **)((long)local_e8 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_e8 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x80);
  TApp::run(this_00);
  local_168.data_ = (AssertHelperData *)0x3;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--string","");
  local_160.data_ = (AssertHelperData *)CLI::App::count(this_01,&local_90);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_148,"(size_t)3","app.count(\"--string\")",
             (unsigned_long *)&local_168,(unsigned_long *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_168.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_168.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&local_148,"answer","strvec",&local_a8,&local_c8);
  if ((char)local_148._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_148._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3bf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_168.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_168.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_01);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"one","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"two","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_148,
             local_108);
  lVar4 = 0;
  do {
    if (local_118 + lVar4 != *(undefined1 **)((long)local_128 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_128 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(this_00);
  }
  testing::Message::Message((Message *)&local_148);
  testing::internal::AssertHelper::AssertHelper
            (&local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3c3,
             "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_148._M_dataplus._M_p + 8))();
    }
  }
  CLI::App::reset(this_01);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(this_00);
  }
  testing::Message::Message((Message *)&local_148);
  testing::internal::AssertHelper::AssertHelper
            (&local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3c6,
             "Expected: run() throws an exception of type CLI::ParseError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_148._M_dataplus._M_p + 8))();
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

TEST_F(TApp, VectorFancyOpts) {
    std::vector<std::string> strvec;
    std::vector<std::string> answer{"mystring", "mystring2", "mystring3"};

    CLI::Option *opt = app.add_option("-s,--string", strvec)->required()->expected(3);
    EXPECT_EQ(3, opt->get_expected());

    args = {"--string", "mystring", "mystring2", "mystring3"};
    run();
    EXPECT_EQ((size_t)3, app.count("--string"));
    EXPECT_EQ(answer, strvec);

    app.reset();
    args = {"one", "two"};
    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();
    EXPECT_THROW(run(), CLI::ParseError);
}